

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99ParamsStd(stb99_params *params,stb99_seed *seed,char *name)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  size_t *src;
  stb99_params *buf;
  
  bVar1 = memIsValid(params,0x3d0);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if (seed == (stb99_seed *)0x0) {
    sVar3 = 0x3d0;
    buf = params;
  }
  else {
    bVar1 = memIsValid(seed,0x128);
    if (bVar1 == 0) {
      return 0x6d;
    }
    memSet(params,'\0',0x3d0);
    sVar3 = 0x128;
    buf = (stb99_params *)seed;
  }
  memSet(buf,'\0',sVar3);
  iVar2 = strCmp(name,"test");
  if (iVar2 == 0) {
    params->l = 0x27e;
    params->r = 0x8f;
    memCopy(params->p,_test_params_p,0x50);
    memCopy(params->q,_test_params_q,0x12);
    memCopy(params->a,_test_params_a,0x50);
    memCopy(params->d,"\x05",1);
    if (seed == (stb99_seed *)0x0) {
      return 0;
    }
    seed->l = 0x27e;
    memCopy(seed->zi,_test_params_zi,0x3e);
    memCopy(seed->di,_test_params_di,0x28);
    src = _test_params_ri;
  }
  else {
    iVar2 = strCmp(name,"1.2.112.0.2.0.1176.2.3.3.1");
    if (iVar2 == 0) {
      params->l = 0x3fe;
      params->r = 0xaf;
      memCopy(params->p,_bds_params3_p,0x80);
      memCopy(params->q,_bds_params3_q,0x16);
      memCopy(params->a,_bds_params3_a,0x80);
      memCopy(params->d,"\x05",1);
      if (seed == (stb99_seed *)0x0) {
        return 0;
      }
      seed->l = 0x3fe;
      memCopy(seed->zi,_bds_params_zi,0x3e);
      memCopy(seed->di,_bds_params3_di,0x30);
      src = _bds_params3_ri;
    }
    else {
      iVar2 = strCmp(name,"1.2.112.0.2.0.1176.2.3.6.1");
      if (iVar2 != 0) {
        iVar2 = strCmp(name,"1.2.112.0.2.0.1176.2.3.10.1");
        if (iVar2 != 0) {
          return 0xca;
        }
        params->l = 0x99e;
        params->r = 0x101;
        memCopy(params->p,_bds_params10_p,0x134);
        memCopy(params->q,_bds_params10_q,0x21);
        memCopy(params->a,_bds_params10_a,0x134);
        memCopy(params->d,"\x05",1);
        if (seed == (stb99_seed *)0x0) {
          return 0;
        }
        seed->l = 0x99e;
        memCopy(seed->zi,_bds_params_zi,0x3e);
        memCopy(seed->di,_bds_params10_di,0x38);
        src = _bds_params10_ri;
        sVar3 = 0x28;
        goto LAB_0013a7eb;
      }
      params->l = 0x5fe;
      params->r = 0xd0;
      memCopy(params->p,_bds_params6_p,0xc0);
      memCopy(params->q,_bds_params6_q,0x1a);
      memCopy(params->a,_bds_params6_a,0xc0);
      memCopy(params->d,"\x05",1);
      if (seed == (stb99_seed *)0x0) {
        return 0;
      }
      seed->l = 0x5fe;
      memCopy(seed->zi,_bds_params_zi,0x3e);
      memCopy(seed->di,_bds_params6_di,0x30);
      src = _bds_params6_ri;
    }
  }
  sVar3 = 0x20;
LAB_0013a7eb:
  memCopy(seed->ri,src,sVar3);
  return 0;
}

Assistant:

err_t stb99ParamsStd(stb99_params* params, stb99_seed* seed, const char* name)
{
	if (!memIsValid(params, sizeof(stb99_params)) ||
		!memIsNullOrValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// подготовить params и seed
	memSetZero(params, sizeof(stb99_params));
	if (seed)
		memSetZero(seed, sizeof(stb99_seed));
	// найти params
	if (strEq(name, _test_params_name))
	{
		params->l = _test_params_l;
		params->r = _test_params_r;
		memCopy(params->p, _test_params_p, sizeof(_test_params_p));
		memCopy(params->q, _test_params_q, sizeof(_test_params_q));
		memCopy(params->a, _test_params_a, sizeof(_test_params_a));
		memCopy(params->d, _test_params_d, sizeof(_test_params_d));
		if (seed)
		{
			seed->l = _test_params_l;
			memCopy(seed->zi, _test_params_zi, sizeof(_test_params_zi));
			memCopy(seed->di, _test_params_di, sizeof(_test_params_di));
			memCopy(seed->ri, _test_params_ri, sizeof(_test_params_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params3_name))
	{
		params->l = _bds_params3_l;
		params->r = _bds_params3_r;
		memCopy(params->p, _bds_params3_p, sizeof(_bds_params3_p));
		memCopy(params->q, _bds_params3_q, sizeof(_bds_params3_q));
		memCopy(params->a, _bds_params3_a, sizeof(_bds_params3_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params3_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params3_di, sizeof(_bds_params3_di));
			memCopy(seed->ri, _bds_params3_ri, sizeof(_bds_params3_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params6_name))
	{
		params->l = _bds_params6_l;
		params->r = _bds_params6_r;
		memCopy(params->p, _bds_params6_p, sizeof(_bds_params6_p));
		memCopy(params->q, _bds_params6_q, sizeof(_bds_params6_q));
		memCopy(params->a, _bds_params6_a, sizeof(_bds_params6_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params6_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params6_di, sizeof(_bds_params6_di));
			memCopy(seed->ri, _bds_params6_ri, sizeof(_bds_params6_ri));
		}
		return ERR_OK;
	}
	if (strEq(name, _bds_params10_name))
	{
		params->l = _bds_params10_l;
		params->r = _bds_params10_r;
		memCopy(params->p, _bds_params10_p, sizeof(_bds_params10_p));
		memCopy(params->q, _bds_params10_q, sizeof(_bds_params10_q));
		memCopy(params->a, _bds_params10_a, sizeof(_bds_params10_a));
		memCopy(params->d, _bds_params_d, sizeof(_bds_params_d));
		if (seed)
		{
			seed->l = _bds_params10_l;
			memCopy(seed->zi, _bds_params_zi, sizeof(_bds_params_zi));
			memCopy(seed->di, _bds_params10_di, sizeof(_bds_params10_di));
			memCopy(seed->ri, _bds_params10_ri, sizeof(_bds_params10_ri));
		}
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}